

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

GenericPackage * __thiscall
ASDCP::MXF::GenericPackage::InitFromTLVSet(GenericPackage *this,TLVReader *TLVSet)

{
  bool has_value;
  int iVar1;
  MDDEntry *pMVar2;
  MDDEntry *pMVar3;
  MDDEntry *in_RDX;
  TLVReader local_240;
  TLVReader local_1d8;
  TLVReader local_170;
  TLVReader local_108;
  TLVReader local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVReader *TLVSet_local;
  GenericPackage *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOReader.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x1da,
                  "virtual ASDCP::Result_t ASDCP::MXF::GenericPackage::InitFromTLVSet(TLVReader &)")
    ;
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::InitFromTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_GenericPackage_PackageUID);
    TLVReader::ReadObject(&local_a0,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,MDD_GenericPackage_Name)
    ;
    optional_property<ASDCP::MXF::UTF16String>::get
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[2].m_Lookup);
    TLVReader::ReadObject(&local_108,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
    has_value = Kumu::Result_t::operator==((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    optional_property<ASDCP::MXF::UTF16String>::set_has_value
              ((optional_property<ASDCP::MXF::UTF16String> *)&TLVSet[2].m_Lookup,has_value);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_GenericPackage_PackageCreationDate);
    TLVReader::ReadObject(&local_170,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_170);
    Kumu::Result_t::~Result_t((Result_t *)&local_170);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar1) {
    pMVar2 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_GenericPackage_PackageModifiedDate);
    TLVReader::ReadObject(&local_1d8,pMVar3,(IArchive *)pMVar2);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_1d8);
    Kumu::Result_t::~Result_t((Result_t *)&local_1d8);
  }
  iVar1 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if (-1 < iVar1) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOReader.m_p,
                              MDD_GenericPackage_Tracks);
    TLVReader::ReadObject(&local_240,local_20,(IArchive *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_240);
    Kumu::Result_t::~Result_t((Result_t *)&local_240);
  }
  return this;
}

Assistant:

ASDCP::Result_t
GenericPackage::InitFromTLVSet(TLVReader& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::InitFromTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageUID));
  if ( ASDCP_SUCCESS(result) ) {
    result = TLVSet.ReadObject(OBJ_READ_ARGS_OPT(GenericPackage, Name));
    Name.set_has_value( result == RESULT_OK );
  }
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageCreationDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, PackageModifiedDate));
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.ReadObject(OBJ_READ_ARGS(GenericPackage, Tracks));
  return result;
}